

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

PVG_FT_Error PVG_FT_Stroker_ParseOutline(PVG_FT_Stroker stroker,PVG_FT_Outline *outline)

{
  PVG_FT_Bool PVar1;
  PVG_FT_Vector *pPVar2;
  char *pcVar3;
  PVG_FT_Pos *pPVar4;
  PVG_FT_Error PVar5;
  PVG_FT_Vector *pPVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  PVG_FT_Vector *pPVar11;
  long lVar12;
  PVG_FT_Vector *pPVar13;
  bool bVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  PVG_FT_Vector vec;
  PVG_FT_Vector v_start;
  PVG_FT_Vector v_control;
  PVG_FT_Vector vec2;
  PVG_FT_Vector vec_1;
  PVG_FT_Vector local_a8;
  PVG_FT_Vector local_98;
  PVG_FT_Vector local_88;
  PVG_FT_Vector local_78;
  PVG_FT_Outline *local_68;
  PVG_FT_Vector *local_60;
  PVG_FT_Vector *local_58;
  ulong local_50;
  PVG_FT_Vector local_48;
  
  PVar5 = -1;
  if (stroker != (PVG_FT_Stroker)0x0 && outline != (PVG_FT_Outline *)0x0) {
    PVar5 = 0;
    stroker->borders[0].num_points = 0;
    stroker->borders[0].start = -1;
    stroker->borders[0].valid = '\0';
    stroker->borders[1].num_points = 0;
    stroker->borders[1].start = -1;
    stroker->borders[1].valid = '\0';
    iVar10 = outline->n_contours;
    if (0 < iVar10) {
      local_58 = &stroker->center;
      local_60 = &stroker->subpath_start;
      lVar12 = 0;
      uVar9 = 0;
      local_68 = outline;
      do {
        uVar8 = outline->contours[lVar12];
        local_50 = (ulong)uVar8;
        if (uVar9 < uVar8) {
          pPVar2 = outline->points;
          pPVar13 = pPVar2 + local_50;
          pPVar6 = pPVar2 + uVar9;
          lVar15 = pPVar2[uVar9].x;
          local_98.y = pPVar2[uVar9].y;
          local_98.x = pPVar13->x;
          pPVar4 = &pPVar13->y;
          local_88.x = pPVar2[uVar9].x;
          local_88.y = pPVar2[uVar9].y;
          pcVar3 = outline->tags;
          pbVar7 = (byte *)(pcVar3 + uVar9);
          if ((pcVar3[uVar9] & 3U) == 0) {
            if ((pcVar3[local_50] & 3U) == 1) {
              pPVar13 = pPVar13 + -1;
              local_98.y = *pPVar4;
            }
            else {
              local_98.x = local_98.x + lVar15;
              lVar15 = *pPVar4 + local_98.y;
              uVar16 = local_98.x - (local_98.x >> 0x3f);
              uVar17 = lVar15 - (lVar15 >> 0x3f);
              local_98.x = CONCAT44((int)((long)uVar16 >> 0x21),(int)(uVar16 >> 1));
              local_88.x = CONCAT44((int)((long)uVar17 >> 0x21),(int)(uVar17 >> 1));
            }
            pPVar6 = pPVar6 + -1;
            pbVar7 = pbVar7 + -1;
          }
          else {
            local_98.x = lVar15;
            if ((pcVar3[uVar9] & 3U) == 2) {
              return -2;
            }
          }
          PVar1 = outline->contours_flag[lVar12];
          stroker->first_point = '\x01';
          local_58->x = local_98.x;
          local_58->y = local_98.y;
          stroker->subpath_open = PVar1;
          bVar14 = true;
          if (stroker->line_join == PVG_FT_STROKER_LINEJOIN_ROUND) {
            if (PVar1 == '\0') {
              bVar14 = false;
            }
            else {
              bVar14 = stroker->line_cap == PVG_FT_STROKER_LINECAP_BUTT;
            }
          }
          stroker->handle_wide_strokes = bVar14;
          local_60->x = local_98.x;
          local_60->y = local_98.y;
          stroker->angle_in = 0;
          while (pPVar6 < pPVar13) {
            pPVar2 = pPVar6 + 1;
            if ((pbVar7[1] & 3) == 0) {
              local_88.x = pPVar2->x;
              local_88.y = pPVar6[1].y;
              if (pPVar13 <= pPVar2) {
LAB_0011d832:
                PVG_FT_Stroker_ConicTo(stroker,&local_88,&local_98);
                break;
              }
              pbVar7 = pbVar7 + 2;
              pPVar6 = pPVar6 + 2;
              while( true ) {
                local_a8.x = pPVar6->x;
                local_a8.y = pPVar6->y;
                if ((*pbVar7 & 3) != 0) break;
                uVar16 = (local_a8.x + local_88.x) - (local_a8.x + local_88.x >> 0x3f);
                uVar17 = (local_a8.y + local_88.y) - (local_a8.y + local_88.y >> 0x3f);
                local_78.x = CONCAT44((int)((long)uVar16 >> 0x21),(int)(uVar16 >> 1));
                local_68 = (PVG_FT_Outline *)
                           CONCAT44((int)((long)uVar17 >> 0x21),(int)(uVar17 >> 1));
                PVG_FT_Stroker_ConicTo(stroker,&local_88,&local_78);
                local_88.x = local_a8.x;
                local_88.y = local_a8.y;
                pbVar7 = pbVar7 + 1;
                bVar14 = pPVar13 <= pPVar6;
                pPVar6 = pPVar6 + 1;
                if (bVar14) goto LAB_0011d832;
              }
              if ((*pbVar7 & 3) != 1) {
                return -2;
              }
              PVG_FT_Stroker_ConicTo(stroker,&local_88,&local_a8);
            }
            else if ((pbVar7[1] & 3) == 1) {
              pbVar7 = pbVar7 + 1;
              local_a8.x = pPVar2->x;
              local_a8.y = pPVar6[1].y;
              PVG_FT_Stroker_LineTo(stroker,&local_a8);
              pPVar6 = pPVar2;
            }
            else {
              if ((pPVar13 < pPVar6 + 2) || ((pbVar7[2] & 3) != 2)) {
                return -2;
              }
              pPVar11 = pPVar6 + 3;
              local_a8.x = pPVar2->x;
              local_a8.y = pPVar6[1].y;
              local_78.x = pPVar6[2].x;
              local_78.y = pPVar6[2].y;
              if (pPVar13 < pPVar11) {
                PVG_FT_Stroker_CubicTo(stroker,&local_a8,&local_78,&local_98);
                break;
              }
              pbVar7 = pbVar7 + 3;
              local_48.x = pPVar11->x;
              local_48.y = pPVar6[3].y;
              PVG_FT_Stroker_CubicTo(stroker,&local_a8,&local_78,&local_48);
              pPVar6 = pPVar11;
            }
          }
          if (stroker->first_point != '\0') {
            stroker->subpath_open = '\x01';
            ft_stroker_subpath_start(stroker,0,0);
          }
          PVG_FT_Stroker_EndSubPath(stroker);
          iVar10 = local_68->n_contours;
          uVar8 = (uint)local_50;
          outline = local_68;
        }
        uVar9 = uVar8 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar10);
      PVar5 = 0;
    }
  }
  return PVar5;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_ParseOutline(PVG_FT_Stroker        stroker,
                                       const PVG_FT_Outline* outline)
{
    PVG_FT_Vector v_last;
    PVG_FT_Vector v_control;
    PVG_FT_Vector v_start;

    PVG_FT_Vector* point;
    PVG_FT_Vector* limit;
    char*         tags;

    PVG_FT_Error error;

    PVG_FT_Int  n;     /* index of contour in outline     */
    PVG_FT_UInt first; /* index of first point in contour */
    PVG_FT_Int  tag;   /* current point's state           */

    if (!outline || !stroker) return -1;  // PVG_FT_THROW( Invalid_Argument );

    PVG_FT_Stroker_Rewind(stroker);

    first = 0;

    for (n = 0; n < outline->n_contours; n++) {
        PVG_FT_UInt last; /* index of last point in contour */

        last = outline->contours[n];
        limit = outline->points + last;

        /* skip empty points; we don't stroke these */
        if (last <= first) {
            first = last + 1;
            continue;
        }

        v_start = outline->points[first];
        v_last = outline->points[last];

        v_control = v_start;

        point = outline->points + first;
        tags = outline->tags + first;
        tag = PVG_FT_CURVE_TAG(tags[0]);

        /* A contour cannot start with a cubic control point! */
        if (tag == PVG_FT_CURVE_TAG_CUBIC) goto Invalid_Outline;

        /* check first point to determine origin */
        if (tag == PVG_FT_CURVE_TAG_CONIC) {
            /* First point is conic control.  Yes, this happens. */
            if (PVG_FT_CURVE_TAG(outline->tags[last]) == PVG_FT_CURVE_TAG_ON) {
                /* start at last point if it is on the curve */
                v_start = v_last;
                limit--;
            } else {
                /* if both first and last points are conic, */
                /* start at their middle                    */
                v_start.x = (v_start.x + v_last.x) / 2;
                v_start.y = (v_start.y + v_last.y) / 2;
            }
            point--;
            tags--;
        }

        error = PVG_FT_Stroker_BeginSubPath(stroker, &v_start, outline->contours_flag[n]);
        if (error) goto Exit;

        while (point < limit) {
            point++;
            tags++;

            tag = PVG_FT_CURVE_TAG(tags[0]);
            switch (tag) {
            case PVG_FT_CURVE_TAG_ON: /* emit a single line_to */
            {
                PVG_FT_Vector vec;

                vec.x = point->x;
                vec.y = point->y;

                error = PVG_FT_Stroker_LineTo(stroker, &vec);
                if (error) goto Exit;
                continue;
            }

            case PVG_FT_CURVE_TAG_CONIC: /* consume conic arcs */
                v_control.x = point->x;
                v_control.y = point->y;

            Do_Conic:
                if (point < limit) {
                    PVG_FT_Vector vec;
                    PVG_FT_Vector v_middle;

                    point++;
                    tags++;
                    tag = PVG_FT_CURVE_TAG(tags[0]);

                    vec = point[0];

                    if (tag == PVG_FT_CURVE_TAG_ON) {
                        error =
                            PVG_FT_Stroker_ConicTo(stroker, &v_control, &vec);
                        if (error) goto Exit;
                        continue;
                    }

                    if (tag != PVG_FT_CURVE_TAG_CONIC) goto Invalid_Outline;

                    v_middle.x = (v_control.x + vec.x) / 2;
                    v_middle.y = (v_control.y + vec.y) / 2;

                    error =
                        PVG_FT_Stroker_ConicTo(stroker, &v_control, &v_middle);
                    if (error) goto Exit;

                    v_control = vec;
                    goto Do_Conic;
                }

                error = PVG_FT_Stroker_ConicTo(stroker, &v_control, &v_start);
                goto Close;

            default: /* PVG_FT_CURVE_TAG_CUBIC */
            {
                PVG_FT_Vector vec1, vec2;

                if (point + 1 > limit ||
                    PVG_FT_CURVE_TAG(tags[1]) != PVG_FT_CURVE_TAG_CUBIC)
                    goto Invalid_Outline;

                point += 2;
                tags += 2;

                vec1 = point[-2];
                vec2 = point[-1];

                if (point <= limit) {
                    PVG_FT_Vector vec;

                    vec = point[0];

                    error = PVG_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &vec);
                    if (error) goto Exit;
                    continue;
                }

                error = PVG_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &v_start);
                goto Close;
            }
            }
        }

    Close:
        if (error) goto Exit;

        if (stroker->first_point) {
            stroker->subpath_open = TRUE;
            error = ft_stroker_subpath_start(stroker, 0, 0);
            if (error) goto Exit;
        }

        error = PVG_FT_Stroker_EndSubPath(stroker);
        if (error) goto Exit;

        first = last + 1;
    }

    return 0;

Exit:
    return error;

Invalid_Outline:
    return -2;  // PVG_FT_THROW( Invalid_Outline );
}